

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

statement_base * __thiscall
cs::method_constant::translate
          (method_constant *this,context_t *context,
          deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          *raw)

{
  const_reference pptVar1;
  statement_base *psVar2;
  tree_type<cs::token_base_*> *tree;
  shared_ptr<cs::context_type> *in_stack_ffffffffffffff98;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *in_stack_ffffffffffffffa0;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  undefined1 uVar3;
  element_type *in_stack_ffffffffffffffb8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffffc0;
  tree_type<cs::token_base_*> *in_stack_ffffffffffffffc8;
  statement_constant *in_stack_ffffffffffffffd0;
  
  std::
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ::front((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
           *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
  pptVar1 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::at
                      (in_stack_ffffffffffffffa0,(size_type)in_stack_ffffffffffffff98);
  token_expr::get_tree((token_expr *)*pptVar1);
  psVar2 = (statement_base *)statement_base::operator_new((size_t)in_stack_ffffffffffffffa0);
  uVar3 = 1;
  tree_type<cs::token_base_*>::tree_type
            ((tree_type<cs::token_base_*> *)in_stack_ffffffffffffffa0,
             (tree_type<cs::token_base_*> *)in_stack_ffffffffffffff98);
  std::shared_ptr<cs::context_type>::shared_ptr
            ((shared_ptr<cs::context_type> *)&stack0xffffffffffffffb8,in_stack_ffffffffffffff98);
  std::
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ::front((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
           *)CONCAT17(uVar3,in_stack_ffffffffffffffb0));
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::back
            ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
             CONCAT17(uVar3,in_stack_ffffffffffffffb0));
  statement_constant::statement_constant
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
             (context_t *)in_stack_ffffffffffffffc0._M_pi,(token_base *)in_stack_ffffffffffffffb8);
  std::shared_ptr<cs::context_type>::~shared_ptr((shared_ptr<cs::context_type> *)0x24dbea);
  tree_type<cs::token_base_*>::~tree_type((tree_type<cs::token_base_*> *)0x24dbf4);
  return psVar2;
}

Assistant:

statement_base *
	method_constant::translate(const context_t &context, const std::deque<std::deque<token_base *>> &raw)
	{
		tree_type<token_base *> &tree = static_cast<token_expr *>(raw.front().at(1))->get_tree();
		return new statement_constant(tree, context, raw.front().back());
	}